

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

int http1_on_http_version(http1_parser_s *parser,char *version,size_t len)

{
  FIOBJ FVar1;
  timespec tVar2;
  uint8_t *local_30;
  __syscall_slong_t local_28;
  size_t len_local;
  char *version_local;
  http1_parser_s *parser_local;
  
  FVar1 = fiobj_str_new(version,len);
  parser[2].state.read = FVar1;
  parser[4].state.next = parser[4].state.next + len;
  tVar2 = fio_last_tick();
  local_30 = (uint8_t *)tVar2.tv_sec;
  parser[1].state.next = local_30;
  local_28 = tVar2.tv_nsec;
  *(__syscall_slong_t *)&parser[1].state.reserved = local_28;
  return 0;
}

Assistant:

static int http1_on_http_version(http1_parser_s *parser, char *version,
                                 size_t len) {
  http1_pr2handle(parser2http(parser)).version = fiobj_str_new(version, len);
  parser2http(parser)->header_size += len;
/* start counting - occurs on the first line of both requests and responses */
#if FIO_HTTP_EXACT_LOGGING
  clock_gettime(CLOCK_REALTIME,
                &http1_pr2handle(parser2http(parser)).received_at);
#else
  http1_pr2handle(parser2http(parser)).received_at = fio_last_tick();
#endif
  return 0;
}